

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove2<(moira::Instr)71,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  
  uVar2 = *(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  bVar1 = writeOp<(moira::Mode)2,(moira::Size)4,64ul>(this,opcode >> 9 & 7,uVar2);
  if (bVar1) {
    (this->reg).sr.n = SUB41(uVar2 >> 0x1f,0);
    (this->reg).sr.z = uVar2 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
  }
  return;
}

Assistant:

void
Moira::execMove2(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_AI,S,AE_INC_PC> (dst, data)) return;
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}